

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O1

uint __thiscall llvm::APInt::getMinSignedBits(APInt *this)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  
  bVar3 = operator[](this,this->BitWidth - 1);
  uVar1 = this->BitWidth;
  if (bVar3) {
    if (uVar1 < 0x41) {
      uVar5 = (this->U).VAL << (-(char)uVar1 & 0x3fU) ^ 0xffffffffffffffff;
      if (uVar5 == 0) {
        uVar4 = 0x40;
      }
      else {
        lVar2 = 0x3f;
        if (uVar5 != 0) {
          for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        uVar4 = (uint)lVar2 ^ 0x3f;
      }
    }
    else {
      uVar4 = countLeadingOnesSlowCase(this);
    }
  }
  else if (uVar1 < 0x41) {
    uVar5 = (this->U).VAL;
    if (uVar5 == 0) {
      uVar4 = 0x40;
    }
    else {
      lVar2 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      uVar4 = (uint)lVar2 ^ 0x3f;
    }
    uVar4 = (uVar1 - 0x40) + uVar4;
  }
  else {
    uVar4 = countLeadingZerosSlowCase(this);
  }
  return (uVar1 - uVar4) + 1;
}

Assistant:

unsigned getMinSignedBits() const {
    if (isNegative())
      return BitWidth - countLeadingOnes() + 1;
    return getActiveBits() + 1;
  }